

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
calc_avg(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        *history,vector<double,_std::allocator<double>_> *new_values,size_t avg_amount)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  double *d;
  ulong uVar4;
  const_reference pvVar5;
  ostream *poVar6;
  const_reference pvVar7;
  reference pvVar8;
  double *pdVar9;
  vector<double,_std::allocator<double>_> *__range1;
  uint uVar10;
  size_t j;
  ulong __n;
  size_t i;
  ulong uVar11;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,new_values);
  uVar4 = ((long)(history->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(history->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18 + 1;
  if (avg_amount <= uVar4) {
    uVar4 = avg_amount;
  }
  for (uVar11 = 0; uVar11 != uVar4; uVar11 = uVar11 + 1) {
    iVar3 = (int)(((long)(history->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(history->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 0x18);
    uVar10 = ~(uint)uVar11 + iVar3;
    if (((int)uVar10 < 0) || (iVar3 <= (int)uVar10)) break;
    pvVar5 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::at(history,(ulong)(uVar10 & 0x7fffffff));
    if ((long)(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start !=
        (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start) {
      poVar6 = std::operator<<((ostream *)&std::cout,"ERROR: history and result size mismatch!");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    for (__n = 0; __n < (ulong)((long)(__return_storage_ptr__->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)(__return_storage_ptr__->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::at(history,(ulong)(uVar10 & 0x7fffffff));
      pvVar7 = std::vector<double,_std::allocator<double>_>::at(pvVar5,__n);
      dVar1 = *pvVar7;
      pvVar8 = std::vector<double,_std::allocator<double>_>::at(__return_storage_ptr__,__n);
      *pvVar8 = dVar1 + *pvVar8;
    }
  }
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar9 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start; pdVar9 != pdVar2; pdVar9 = pdVar9 + 1) {
    *pdVar9 = *pdVar9 / (((double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25
                         ) + ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> calc_avg(const vector<vector<double>>& history,
                             const vector<double>& new_values,
                             size_t avg_amount) {
    vector<double> result(new_values);

    // If we don't have enough values yet, use what's there (+ 1 because new values)
    avg_amount = std::min(avg_amount, history.size() + 1);

    for (size_t i = 0; i < avg_amount; i++) {
        const int index = history.size() - 1 - i;

        if (index < 0 || index >= (int)history.size()) {
            break;
        }

        if (history.at(index).size() != result.size()) {
            // TODO make this an assert
            cout << "ERROR: history and result size mismatch!" << endl;
        }

        for (size_t j = 0; j < result.size(); j++) {
            result.at(j) += history.at(index).at(j);
        }
    }

    for(double& d : result) {
        d /= avg_amount;
    }

    return result;
}